

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

void chaiscript::bootstrap::Bootstrap::opers_arithmetic_pod(Module *m)

{
  Module *pMVar1;
  allocator<char> local_819;
  string local_818;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_7f8;
  Proxy_Function local_7f0;
  allocator<char> local_7d9;
  string local_7d8;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_7b8;
  Proxy_Function local_7b0;
  allocator<char> local_799;
  string local_798;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_778;
  Proxy_Function local_770;
  allocator<char> local_759;
  string local_758;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_738;
  Proxy_Function local_730;
  allocator<char> local_719;
  string local_718;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_6f8;
  Proxy_Function local_6f0;
  allocator<char> local_6d9;
  string local_6d8;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_6b8;
  Proxy_Function local_6b0;
  allocator<char> local_699;
  string local_698;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_678;
  Proxy_Function local_670;
  allocator<char> local_659;
  string local_658;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_638;
  Proxy_Function local_630;
  allocator<char> local_619;
  string local_618;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_5f8;
  Proxy_Function local_5f0;
  allocator<char> local_5d9;
  string local_5d8;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_5b8;
  Proxy_Function local_5b0;
  allocator<char> local_599;
  string local_598;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_578;
  Proxy_Function local_570;
  allocator<char> local_559;
  string local_558;
  _func_Boxed_Number_Boxed_Number_ptr *local_538;
  Proxy_Function local_530;
  allocator<char> local_519;
  string local_518;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_4f8;
  Proxy_Function local_4f0;
  allocator<char> local_4d9;
  string local_4d8;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_4b8;
  Proxy_Function local_4b0;
  allocator<char> local_499;
  string local_498;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_478;
  Proxy_Function local_470;
  allocator<char> local_459;
  string local_458;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_438;
  Proxy_Function local_430;
  allocator<char> local_419;
  string local_418;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_3f8;
  Proxy_Function local_3f0;
  allocator<char> local_3d9;
  string local_3d8;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_3b8;
  Proxy_Function local_3b0;
  allocator<char> local_399;
  string local_398;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_378;
  Proxy_Function local_370;
  allocator<char> local_359;
  string local_358;
  _func_Boxed_Number_Boxed_Number_Boxed_Number_ptr *local_338;
  Proxy_Function local_330;
  allocator<char> local_319;
  string local_318;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_2f8;
  Proxy_Function local_2f0;
  allocator<char> local_2d9;
  string local_2d8;
  _func_Boxed_Number_Boxed_Number_ptr *local_2b8;
  Proxy_Function local_2b0;
  allocator<char> local_299;
  string local_298;
  _func_Boxed_Number_Boxed_Number_ptr *local_278;
  Proxy_Function local_270;
  allocator<char> local_259;
  string local_258;
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *local_238;
  Proxy_Function local_230;
  allocator<char> local_219;
  string local_218;
  _func_Boxed_Number_Boxed_Number *local_1f8;
  Proxy_Function local_1f0;
  allocator<char> local_1d9;
  string local_1d8;
  _func_Boxed_Number_Boxed_Number *local_1b8;
  Proxy_Function local_1b0;
  allocator<char> local_199;
  string local_198;
  _func_bool_Boxed_Number_ptr_Boxed_Number_ptr *local_178;
  Proxy_Function local_170;
  allocator<char> local_159;
  string local_158;
  _func_bool_Boxed_Number_ptr_Boxed_Number_ptr *local_138;
  Proxy_Function local_130;
  allocator<char> local_119;
  string local_118;
  _func_bool_Boxed_Number_ptr_Boxed_Number_ptr *local_f8;
  Proxy_Function local_f0;
  allocator<char> local_d9;
  string local_d8;
  _func_bool_Boxed_Number_ptr_Boxed_Number_ptr *local_b8;
  Proxy_Function local_b0;
  allocator<char> local_99;
  string local_98;
  _func_bool_Boxed_Number_ptr_Boxed_Number_ptr *local_78;
  Proxy_Function local_70 [2];
  allocator<char> local_49;
  string local_48;
  _func_bool_Boxed_Number_ptr_Boxed_Number_ptr *local_28;
  Proxy_Function local_20;
  Module *local_10;
  Module *m_local;
  
  local_28 = Boxed_Number::equals;
  local_10 = m;
  fun<bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_20,&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"==",&local_49);
  Module::add(m,&local_20,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_20);
  pMVar1 = local_10;
  local_78 = Boxed_Number::less_than;
  fun<bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)local_70,&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"<",&local_99);
  Module::add(pMVar1,local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_70);
  pMVar1 = local_10;
  local_b8 = Boxed_Number::greater_than;
  fun<bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_b0,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,">",&local_d9);
  Module::add(pMVar1,&local_b0,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_b0);
  pMVar1 = local_10;
  local_f8 = Boxed_Number::greater_than_equal;
  fun<bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_f0,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,">=",&local_119);
  Module::add(pMVar1,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_f0);
  pMVar1 = local_10;
  local_138 = Boxed_Number::less_than_equal;
  fun<bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_130,&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"<=",&local_159);
  Module::add(pMVar1,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_130);
  pMVar1 = local_10;
  local_178 = Boxed_Number::not_equal;
  fun<bool(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_170,&local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"!=",&local_199);
  Module::add(pMVar1,&local_170,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_170);
  pMVar1 = local_10;
  local_1b8 = Boxed_Number::pre_decrement;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number)>((chaiscript *)&local_1b0,&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"--",&local_1d9);
  Module::add(pMVar1,&local_1b0,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1b0);
  pMVar1 = local_10;
  local_1f8 = Boxed_Number::pre_increment;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number)>((chaiscript *)&local_1f0,&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"++",&local_219);
  Module::add(pMVar1,&local_1f0,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1f0);
  pMVar1 = local_10;
  local_238 = Boxed_Number::sum;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_230,&local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"+",&local_259);
  Module::add(pMVar1,&local_230,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_230);
  pMVar1 = local_10;
  local_278 = Boxed_Number::unary_plus;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_270,&local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"+",&local_299);
  Module::add(pMVar1,&local_270,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_270);
  pMVar1 = local_10;
  local_2b8 = Boxed_Number::unary_minus;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_2b0,&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"-",&local_2d9);
  Module::add(pMVar1,&local_2b0,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_2b0);
  pMVar1 = local_10;
  local_2f8 = Boxed_Number::difference;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_2f0,&local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"-",&local_319);
  Module::add(pMVar1,&local_2f0,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_2f0);
  pMVar1 = local_10;
  local_338 = Boxed_Number::assign_bitwise_and;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_330,&local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"&=",&local_359);
  Module::add(pMVar1,&local_330,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_330);
  pMVar1 = local_10;
  local_378 = Boxed_Number::assign;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_370,&local_378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"=",&local_399);
  Module::add(pMVar1,&local_370,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_370);
  pMVar1 = local_10;
  local_3b8 = Boxed_Number::assign_bitwise_or;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_3b0,&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"|=",&local_3d9);
  Module::add(pMVar1,&local_3b0,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_3b0);
  pMVar1 = local_10;
  local_3f8 = Boxed_Number::assign_bitwise_xor;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_3f0,&local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"^=",&local_419);
  Module::add(pMVar1,&local_3f0,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_3f0);
  pMVar1 = local_10;
  local_438 = Boxed_Number::assign_remainder;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_430,&local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"%=",&local_459);
  Module::add(pMVar1,&local_430,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_430);
  pMVar1 = local_10;
  local_478 = Boxed_Number::assign_shift_left;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_470,&local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"<<=",&local_499);
  Module::add(pMVar1,&local_470,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_470);
  pMVar1 = local_10;
  local_4b8 = Boxed_Number::assign_shift_right;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_4b0,&local_4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,">>=",&local_4d9);
  Module::add(pMVar1,&local_4b0,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_4b0);
  pMVar1 = local_10;
  local_4f8 = Boxed_Number::bitwise_and;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_4f0,&local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"&",&local_519);
  Module::add(pMVar1,&local_4f0,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_4f0);
  pMVar1 = local_10;
  local_538 = Boxed_Number::bitwise_complement;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_530,&local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"~",&local_559);
  Module::add(pMVar1,&local_530,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_530);
  pMVar1 = local_10;
  local_578 = Boxed_Number::bitwise_xor;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_570,&local_578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"^",&local_599);
  Module::add(pMVar1,&local_570,&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_570);
  pMVar1 = local_10;
  local_5b8 = Boxed_Number::bitwise_or;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_5b0,&local_5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"|",&local_5d9);
  Module::add(pMVar1,&local_5b0,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_5b0);
  pMVar1 = local_10;
  local_5f8 = Boxed_Number::assign_product;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_5f0,&local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"*=",&local_619);
  Module::add(pMVar1,&local_5f0,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_5f0);
  pMVar1 = local_10;
  local_638 = Boxed_Number::assign_quotient;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_630,&local_638);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"/=",&local_659);
  Module::add(pMVar1,&local_630,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_630);
  pMVar1 = local_10;
  local_678 = Boxed_Number::assign_sum;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_670,&local_678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"+=",&local_699);
  Module::add(pMVar1,&local_670,&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_670);
  pMVar1 = local_10;
  local_6b8 = Boxed_Number::assign_difference;
  fun<chaiscript::Boxed_Number(*)(chaiscript::Boxed_Number,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_6b0,&local_6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"-=",&local_6d9);
  Module::add(pMVar1,&local_6b0,&local_6d8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_6b0);
  pMVar1 = local_10;
  local_6f8 = Boxed_Number::quotient;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_6f0,&local_6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"/",&local_719);
  Module::add(pMVar1,&local_6f0,&local_718);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_6f0);
  pMVar1 = local_10;
  local_738 = Boxed_Number::shift_left;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_730,&local_738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"<<",&local_759);
  Module::add(pMVar1,&local_730,&local_758);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_730);
  pMVar1 = local_10;
  local_778 = Boxed_Number::product;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_770,&local_778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"*",&local_799);
  Module::add(pMVar1,&local_770,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_770);
  pMVar1 = local_10;
  local_7b8 = Boxed_Number::remainder;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_7b0,&local_7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"%",&local_7d9);
  Module::add(pMVar1,&local_7b0,&local_7d8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_7b0);
  pMVar1 = local_10;
  local_7f8 = Boxed_Number::shift_right;
  fun<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&)>
            ((chaiscript *)&local_7f0,&local_7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,">>",&local_819);
  Module::add(pMVar1,&local_7f0,&local_818);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_7f0);
  return;
}

Assistant:

static void opers_arithmetic_pod(Module &m) {
      m.add(fun(&Boxed_Number::equals), "==");
      m.add(fun(&Boxed_Number::less_than), "<");
      m.add(fun(&Boxed_Number::greater_than), ">");
      m.add(fun(&Boxed_Number::greater_than_equal), ">=");
      m.add(fun(&Boxed_Number::less_than_equal), "<=");
      m.add(fun(&Boxed_Number::not_equal), "!=");

      m.add(fun(&Boxed_Number::pre_decrement), "--");
      m.add(fun(&Boxed_Number::pre_increment), "++");
      m.add(fun(&Boxed_Number::sum), "+");
      m.add(fun(&Boxed_Number::unary_plus), "+");
      m.add(fun(&Boxed_Number::unary_minus), "-");
      m.add(fun(&Boxed_Number::difference), "-");
      m.add(fun(&Boxed_Number::assign_bitwise_and), "&=");
      m.add(fun(&Boxed_Number::assign), "=");
      m.add(fun(&Boxed_Number::assign_bitwise_or), "|=");
      m.add(fun(&Boxed_Number::assign_bitwise_xor), "^=");
      m.add(fun(&Boxed_Number::assign_remainder), "%=");
      m.add(fun(&Boxed_Number::assign_shift_left), "<<=");
      m.add(fun(&Boxed_Number::assign_shift_right), ">>=");
      m.add(fun(&Boxed_Number::bitwise_and), "&");
      m.add(fun(&Boxed_Number::bitwise_complement), "~");
      m.add(fun(&Boxed_Number::bitwise_xor), "^");
      m.add(fun(&Boxed_Number::bitwise_or), "|");
      m.add(fun(&Boxed_Number::assign_product), "*=");
      m.add(fun(&Boxed_Number::assign_quotient), "/=");
      m.add(fun(&Boxed_Number::assign_sum), "+=");
      m.add(fun(&Boxed_Number::assign_difference), "-=");
      m.add(fun(&Boxed_Number::quotient), "/");
      m.add(fun(&Boxed_Number::shift_left), "<<");
      m.add(fun(&Boxed_Number::product), "*");
      m.add(fun(&Boxed_Number::remainder), "%");
      m.add(fun(&Boxed_Number::shift_right), ">>");
    }